

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

bool google::protobuf::compiler::ruby::MaybeEmitDependency
               (FileDescriptor *import,FileDescriptor *from,Printer *printer,string *error)

{
  bool bVar1;
  LogMessage *pLVar2;
  long lVar3;
  long lVar4;
  LogFinisher local_81;
  string local_80;
  undefined1 local_60 [56];
  
  if (*(int *)(import + 0x8c) == 2) {
    if (0 < *(int *)(from + 0x58)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        bVar1 = UsesTypeFromFile((Descriptor *)(*(long *)(from + 0x60) + lVar3),import,error);
        if (bVar1) {
          return false;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0xa8;
      } while (lVar4 < *(int *)(from + 0x58));
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0x1a8);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_60,"Omitting proto2 dependency \'");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)import);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\' from proto3 output file \'");
    GetOutputFilename(&local_80,*(string **)from);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_80);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        "\' because we don\'t support proto2 and no proto2 types from that file are being used."
                       );
    internal::LogFinisher::operator=(&local_81,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  else {
    GetRequireName((string *)local_60,*(string **)import);
    io::Printer::Print(printer,"require \'$name$\'\n","name",(string *)local_60);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  return true;
}

Assistant:

bool MaybeEmitDependency(const FileDescriptor* import,
                         const FileDescriptor* from,
                         io::Printer* printer,
                         string* error) {
  if (import->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    for (int i = 0; i < from->message_type_count(); i++) {
      if (UsesTypeFromFile(from->message_type(i), import, error)) {
        // Error text was already set by UsesTypeFromFile().
        return false;
      }
    }

    // Ok to omit this proto2 dependency -- so we won't print anything.
    GOOGLE_LOG(WARNING) << "Omitting proto2 dependency '" << import->name()
                        << "' from proto3 output file '"
                        << GetOutputFilename(from->name())
                        << "' because we don't support proto2 and no proto2 "
                           "types from that file are being used.";
    return true;
  } else {
    printer->Print(
      "require '$name$'\n", "name", GetRequireName(import->name()));
    return true;
  }
}